

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

wchar_t prt_health_aux(wchar_t row,wchar_t col)

{
  monster *mon;
  long lVar1;
  byte bVar2;
  _Bool _Var3;
  uint uVar4;
  wchar_t n;
  char *s;
  wchar_t wVar5;
  
  bVar2 = monster_health_attr();
  mon = player->upkeep->health_who;
  if (mon == (monster *)0x0) {
    Term_erase(col,row,L'\f');
    wVar5 = L'\0';
  }
  else {
    _Var3 = monster_is_visible(mon);
    if (((_Var3) && (player->timed[6] == 0)) && (-1 < mon->hp)) {
      lVar1 = (long)(mon->hp * 100) / (long)(int)mon->maxhp;
      uVar4 = (uint)lVar1;
      if ((int)uVar4 < 10) {
        n = L'\x01';
      }
      else if (uVar4 < 0x5a) {
        n = (wchar_t)(byte)((char)(((ushort)lVar1 & 0xff) / 10) + 1);
      }
      else {
        n = L'\n';
      }
      Term_putstr(col,row,L'\f',L'\x01',"[----------]");
      col = col + L'\x01';
      s = "**********";
    }
    else {
      s = "[----------]";
      n = L'\f';
    }
    wVar5 = L'\f';
    Term_putstr(col,row,n,(uint)bVar2,s);
  }
  return wVar5;
}

Assistant:

static int prt_health_aux(int row, int col)
{
	uint8_t attr = monster_health_attr();
	struct monster *mon = player->upkeep->health_who;

	/* Not tracking */
	if (!mon) {
		/* Erase the health bar */
		Term_erase(col, row, 12);
		return 0;
	}

	/* Tracking an unseen, hallucinatory, or dead monster */
	if (!monster_is_visible(mon) || /* Unseen */
		(player->timed[TMD_IMAGE]) || /* Hallucination */
		(mon->hp < 0)) { /* Dead (?) */
		/* The monster health is "unknown" */
		Term_putstr(col, row, 12, attr, "[----------]");
	} else { /* Visible */
		/* Extract the "percent" of health */
		int pct = 100L * mon->hp / mon->maxhp;

		/* Convert percent into "health" */
		int len = (pct < 10) ? 1 : (pct < 90) ? (pct / 10 + 1) : 10;

		/* Default to "unknown" */
		Term_putstr(col, row, 12, COLOUR_WHITE, "[----------]");

		/* Dump the current "health" (use '*' symbols) */
		Term_putstr(col + 1, row, len, attr, "**********");
	}

	return 12;
}